

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O2

void sysbvm_analysisQueue_waitPendingAnalysis(sysbvm_context_t *context,sysbvm_tuple_t queue)

{
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t local_50;
  anon_struct_16_2_b7a6cf6a gcFrame;
  sysbvm_stackFrameRecord_t local_38;
  undefined8 local_28;
  anon_struct_16_2_b7a6cf6a *local_20;
  
  if (queue == 0 || (queue & 0xf) != 0) {
    sysbvm_error("Expected a valid analysis queue.");
  }
  local_20 = &gcFrame;
  gcFrame.entry = (sysbvm_analysisQueueEntry_t *)0x0;
  local_38.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_38.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_38._12_4_ = 0;
  local_28 = 2;
  gcFrame.queue = (sysbvm_analysisQueue_t *)queue;
  sysbvm_stackFrame_pushRecord(&local_38);
  while( true ) {
    gcFrame.entry = (sysbvm_analysisQueueEntry_t *)(gcFrame.queue)->firstEntry;
    if (gcFrame.entry == (sysbvm_analysisQueueEntry_t *)0x0) break;
    sVar1 = (gcFrame.entry)->nextEntry;
    (gcFrame.queue)->firstEntry = sVar1;
    if (sVar1 == 0) {
      (gcFrame.queue)->lastEntry = 0;
    }
    local_50 = (gcFrame.entry)->programEntity;
    sysbvm_tuple_send(context,(context->roots).ensureAnalysisSelector,1,&local_50,0);
  }
  sysbvm_stackFrame_popRecord(&local_38);
  return;
}

Assistant:

SYSBVM_API void sysbvm_analysisQueue_waitPendingAnalysis(sysbvm_context_t *context, sysbvm_tuple_t queue)
{
    if(!sysbvm_tuple_isNonNullPointer(queue))
        sysbvm_error("Expected a valid analysis queue.");

    struct {
        sysbvm_analysisQueue_t *queue;
        sysbvm_analysisQueueEntry_t *entry;
    } gcFrame = {
        .queue = (sysbvm_analysisQueue_t*)queue,
    };
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    while((gcFrame.entry = (sysbvm_analysisQueueEntry_t*)gcFrame.queue->firstEntry) != NULL)
    {
        gcFrame.queue->firstEntry = gcFrame.entry->nextEntry;
        if(!gcFrame.queue->firstEntry)
            gcFrame.queue->lastEntry = SYSBVM_NULL_TUPLE;
        sysbvm_tuple_send0(context, context->roots.ensureAnalysisSelector, gcFrame.entry->programEntity);
    }

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
}